

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::GetComponent<tcu::Vector<float,_4>_>::doApply
          (IRet *__return_storage_ptr__,GetComponent<tcu::Vector<float,_4>_> *this,
          EvalContext *param_1,IArgs *iargs)

{
  long lVar1;
  int compNdx;
  long lVar2;
  undefined8 local_40;
  double dStack_38;
  double local_30;
  
  __return_storage_ptr__->m_hasNaN = false;
  __return_storage_ptr__->m_lo = INFINITY;
  __return_storage_ptr__->m_hi = -INFINITY;
  lVar1 = 0;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    if ((iargs->b->m_lo <= (double)(int)lVar2) && ((double)(int)lVar2 <= iargs->b->m_hi)) {
      tcu::Interval::operator|
                (__return_storage_ptr__,(Interval *)(&iargs->a->m_data[0].m_hasNaN + lVar1));
      __return_storage_ptr__->m_hi = local_30;
      *(undefined8 *)__return_storage_ptr__ = local_40;
      __return_storage_ptr__->m_lo = dStack_38;
    }
    lVar1 = lVar1 + 0x18;
  }
  return __return_storage_ptr__;
}

Assistant:

IRet		doApply		(const EvalContext&,
							 const typename GetComponent::IArgs& iargs) const
	{
		IRet ret;

		for (int compNdx = 0; compNdx < T::SIZE; ++compNdx)
		{
			if (iargs.b.contains(compNdx))
				ret = unionIVal<typename T::Element>(ret, iargs.a[compNdx]);
		}

		return ret;
	}